

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void check_valid_store(FuncState *fs,expdesc *var,expdesc *ex)

{
  LexState *pLVar1;
  int iVar2;
  uint bc;
  char *pcVar3;
  TString *local_a0;
  char *local_68;
  int e_5;
  int e_4;
  int e_3;
  int e_2;
  OpCode opCode;
  int e_1;
  int e;
  ravi_type_map ex_ravi_type_map;
  expdesc *ex_local;
  expdesc *var_local;
  FuncState *fs_local;
  
  if ((ex->k != VNONRELOC) ||
     (((((var->ravi_type_map != 0x10 && (var->ravi_type_map != 8)) && (var->ravi_type_map != 0x40))
       && ((var->ravi_type_map != 0x20 && (var->ravi_type_map != 0x80)))) &&
      ((var->ravi_type_map != 0x101 &&
       ((var->ravi_type_map != 0x201 && (var->ravi_type_map != 0x401)))))))) {
    e_1 = ex->ravi_type_map;
    if (ex->k == VINDEXED) {
      if (e_1 == 0x20) {
        e_1 = 8;
      }
      else if (e_1 == 0x40) {
        e_1 = 0x10;
      }
      else {
        e_1 = -1;
      }
    }
    if (var->ravi_type_map == 0x10) {
      if (e_1 != 0x10) {
        if (e_1 != -1) {
          pLVar1 = fs->ls;
          pcVar3 = luaO_pushfstring(fs->ls->L,"Invalid assignment: number expected");
          luaX_syntaxerror(pLVar1,pcVar3);
        }
        iVar2 = luaK_exp2RK(fs,ex);
        luaK_codeABC(fs,OP_RAVI_TOFLT,iVar2,0,0);
      }
    }
    else if (var->ravi_type_map == 8) {
      if (e_1 != 8) {
        if (e_1 != -1) {
          pLVar1 = fs->ls;
          pcVar3 = luaO_pushfstring(fs->ls->L,"Invalid assignment: integer expected");
          luaX_syntaxerror(pLVar1,pcVar3);
        }
        iVar2 = luaK_exp2RK(fs,ex);
        luaK_codeABC(fs,OP_RAVI_TOINT,iVar2,0,0);
      }
    }
    else if ((var->ravi_type_map & 0xffffff1f) == 0) {
      if (e_1 != var->ravi_type_map) {
        if (e_1 != -1) {
          pLVar1 = fs->ls;
          if (var->ravi_type_map == 0x80) {
            local_68 = "table";
          }
          else {
            local_68 = "integer[]";
            if (var->ravi_type_map == 0x40) {
              local_68 = "number[]";
            }
          }
          pcVar3 = luaO_pushfstring(fs->ls->L,"Invalid assignment: %s expected",local_68);
          luaX_syntaxerror(pLVar1,pcVar3);
        }
        if ((var->ravi_type_map & 0x20) == 0) {
          if ((var->ravi_type_map & 0x40) == 0) {
            e_3 = 0x47;
          }
          else {
            e_3 = 0x46;
          }
        }
        else {
          e_3 = 0x45;
        }
        iVar2 = luaK_exp2RK(fs,ex);
        luaK_codeABC(fs,e_3,iVar2,0,0);
      }
    }
    else if (var->ravi_type_map == 0x101) {
      if ((e_1 & 0xfffffefeU) != 0) {
        if (e_1 != -1) {
          pLVar1 = fs->ls;
          pcVar3 = luaO_pushfstring(fs->ls->L,"Invalid assignment: string expected");
          luaX_syntaxerror(pLVar1,pcVar3);
        }
        iVar2 = luaK_exp2RK(fs,ex);
        luaK_codeABC(fs,OP_RAVI_TOSTRING,iVar2,0,0);
      }
    }
    else if (var->ravi_type_map == 0x201) {
      if ((e_1 & 0xfffffdfeU) != 0) {
        if (e_1 != -1) {
          pLVar1 = fs->ls;
          pcVar3 = luaO_pushfstring(fs->ls->L,"Invalid assignment: function expected");
          luaX_syntaxerror(pLVar1,pcVar3);
        }
        iVar2 = luaK_exp2RK(fs,ex);
        luaK_codeABC(fs,OP_RAVI_TOCLOSURE,iVar2,0,0);
      }
    }
    else if ((var->ravi_type_map == 0x401) &&
            (((e_1 & 0xfffffbfeU) != 0 ||
             (((e_1 & 0x400U) != 0 &&
              ((var->usertype == (TString *)0x0 || (var->usertype != ex->usertype)))))))) {
      if (e_1 != -1) {
        pLVar1 = fs->ls;
        if (var->usertype == (TString *)0x0) {
          local_a0 = (TString *)0x19ff63;
        }
        else {
          local_a0 = var->usertype + 1;
        }
        pcVar3 = luaO_pushfstring(fs->ls->L,"Invalid assignment: usertype %s expected",local_a0);
        luaX_syntaxerror(pLVar1,pcVar3);
      }
      iVar2 = luaK_exp2RK(fs,ex);
      bc = luaK_stringK(fs,var->usertype);
      luaK_codeABx(fs,OP_RAVI_TOTYPE,iVar2,bc);
    }
  }
  return;
}

Assistant:

static void check_valid_store(FuncState *fs, expdesc *var, expdesc *ex) {
  /* VNONRELOC means we have fixed register and do we know the type? */
  if (ex->k == VNONRELOC &&
      (var->ravi_type_map == RAVI_TM_FLOAT ||
       var->ravi_type_map == RAVI_TM_INTEGER ||
       var->ravi_type_map == RAVI_TM_FLOAT_ARRAY ||
       var->ravi_type_map == RAVI_TM_INTEGER_ARRAY ||
       var->ravi_type_map == RAVI_TM_TABLE ||
       var->ravi_type_map == RAVI_TM_STRING_OR_NIL ||
       var->ravi_type_map == RAVI_TM_FUNCTION_OR_NIL ||
       var->ravi_type_map == RAVI_TM_USERDATA_OR_NIL)) {
    /* handled by MOVEI, MOVEF, MOVEIARRAY, MOVEFARRAY at runtime */
    return;
  }
  ravi_type_map ex_ravi_type_map = ex->ravi_type_map;
  if (ex->k == VINDEXED) {
    if (ex_ravi_type_map == RAVI_TM_INTEGER_ARRAY) {
      ex_ravi_type_map = RAVI_TM_INTEGER;
    } else if (ex_ravi_type_map == RAVI_TM_FLOAT_ARRAY) {
      ex_ravi_type_map = RAVI_TM_FLOAT;
    } else {
      ex_ravi_type_map = RAVI_TM_ANY;
    }
  }
  if (var->ravi_type_map == RAVI_TM_FLOAT) {
    if (ex_ravi_type_map == RAVI_TM_FLOAT)
      return;
    if (ex_ravi_type_map == RAVI_TM_ANY) {
      int e = luaK_exp2RK(fs, ex);
      luaK_codeABC(fs, OP_RAVI_TOFLT, e, 0, 0);
      return;
    }
    luaX_syntaxerror(
      fs->ls,
      luaO_pushfstring(
      fs->ls->L,
      "Invalid assignment: number expected"));
  }
  else if (var->ravi_type_map == RAVI_TM_INTEGER) {
    if (ex_ravi_type_map == RAVI_TM_INTEGER)
      return;
    if (ex_ravi_type_map == RAVI_TM_ANY) {
       int e = luaK_exp2RK(fs, ex);
      luaK_codeABC(fs, OP_RAVI_TOINT, e, 0, 0);
      return;
    }
    luaX_syntaxerror(
      fs->ls,
      luaO_pushfstring(
      fs->ls->L,
      "Invalid assignment: integer expected"));
  }
  else if ((var->ravi_type_map & (~(RAVI_TM_INTEGER_ARRAY | RAVI_TM_FLOAT_ARRAY | RAVI_TM_TABLE))) == 0) {
    if (ex_ravi_type_map == var->ravi_type_map)
      return;
    if (ex_ravi_type_map == RAVI_TM_ANY) {
      OpCode opCode;
      if (var->ravi_type_map & RAVI_TM_INTEGER_ARRAY)
        opCode = OP_RAVI_TOIARRAY;
      else if (var->ravi_type_map & RAVI_TM_FLOAT_ARRAY)
        opCode = OP_RAVI_TOFARRAY;
      else
        opCode = OP_RAVI_TOTAB;
      int e = luaK_exp2RK(fs, ex);
      luaK_codeABC(fs, opCode, e, 0, 0);
      return;
    }
    luaX_syntaxerror(
      fs->ls,
      luaO_pushfstring(
      fs->ls->L,
      "Invalid assignment: %s expected",
      var->ravi_type_map == RAVI_TM_TABLE ? "table" : (var->ravi_type_map == RAVI_TM_FLOAT_ARRAY ? "number[]" : "integer[]")));
  }
  else if (var->ravi_type_map == RAVI_TM_STRING_OR_NIL) {
    if ((ex_ravi_type_map & ~RAVI_TM_STRING_OR_NIL) == 0)
      return;
    if (ex_ravi_type_map == RAVI_TM_ANY) {
      int e = luaK_exp2RK(fs, ex);
      luaK_codeABC(fs, OP_RAVI_TOSTRING, e, 0, 0);
      return;
    }
    luaX_syntaxerror(
      fs->ls,
      luaO_pushfstring(
      fs->ls->L,
      "Invalid assignment: string expected"));
  }
  else if (var->ravi_type_map == RAVI_TM_FUNCTION_OR_NIL) {
    if ((ex_ravi_type_map & ~RAVI_TM_FUNCTION_OR_NIL) == 0)
      return;
    if (ex_ravi_type_map == RAVI_TM_ANY) {
      int e = luaK_exp2RK(fs, ex);
      luaK_codeABC(fs, OP_RAVI_TOCLOSURE, e, 0, 0);
      return;
    }
    luaX_syntaxerror(
      fs->ls,
      luaO_pushfstring(
      fs->ls->L,
      "Invalid assignment: function expected"));
  }
  else if (var->ravi_type_map == RAVI_TM_USERDATA_OR_NIL) {
    if ((ex_ravi_type_map & ~RAVI_TM_USERDATA_OR_NIL) == 0 &&
      (!(ex_ravi_type_map & RAVI_TM_USERDATA) || (var->usertype && var->usertype == ex->usertype)))
      return;
    if (ex_ravi_type_map == RAVI_TM_ANY) {
      int e = luaK_exp2RK(fs, ex);
      luaK_codeABx(fs, OP_RAVI_TOTYPE, e, luaK_stringK(fs, var->usertype));
      return;
    }
    luaX_syntaxerror(
      fs->ls,
      luaO_pushfstring(
      fs->ls->L,
      "Invalid assignment: usertype %s expected", (var->usertype ? getstr(var->usertype) : "UNKNOWN")));
  }
}